

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_converters.h
# Opt level: O2

string * __thiscall
common::matrix_to_string_abi_cxx11_(string *__return_storage_ptr__,common *this,Matrix<double> *m)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  string e_string_int;
  string e_string;
  string local_70 [32];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_50);
  for (uVar2 = 0; (ulong)uVar2 < *(ulong *)this; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; (ulong)uVar3 < *(ulong *)(this + 8); uVar3 = uVar3 + 1) {
      pdVar1 = data_structures::Matrix<double>::read_at
                         ((Matrix<double> *)this,(ulong)uVar2,(ulong)uVar3);
      if (*pdVar1 < INFINITY) {
        std::__cxx11::to_string(&local_50,*pdVar1);
        std::__cxx11::string::find((char *)&local_50,0x1090a6);
        std::__cxx11::string::substr((ulong)local_70,(ulong)&local_50);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::pop_back();
  return __return_storage_ptr__;
}

Assistant:

const std::string matrix_to_string(const data_structures::Matrix<double>& m) {
  std::string s("");
  for (unsigned int x = 0; x < m.get_rows(); ++x){
    for (unsigned int y = 0; y < m.get_columns(); ++y){
      double e = m.read_at(x, y);
      if (e == std::numeric_limits<double>::infinity()) {
        s += "@";
      } else {
        std::string e_string = std::to_string(e);
        std::string e_string_int = e_string.substr(0, e_string.find("."));
        s += e_string_int;
      }
    }
    s += "\n";
  }
  s.pop_back();
  return s;
}